

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O2

SelectInst * __thiscall
LLVMBC::LLVMContext::construct<LLVMBC::SelectInst,LLVMBC::Value*&,LLVMBC::Value*&,LLVMBC::Value*&>
          (LLVMContext *this,Value **u,Value **u_1,Value **u_2)

{
  SelectInst *this_00;
  
  this_00 = (SelectInst *)allocate(this,0x70,8);
  if (this_00 != (SelectInst *)0x0) {
    SelectInst::SelectInst(this_00,*u,*u_1,*u_2);
    append_typed_destructor<LLVMBC::SelectInst>(this,this_00);
    return this_00;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}